

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O2

ConversionStream * __thiscall
Diligent::
MakeNewRCObj<Diligent::HLSL2GLSLConverterImpl::ConversionStream,Diligent::IMemoryAllocator>::
operator()(MakeNewRCObj<Diligent::HLSL2GLSLConverterImpl::ConversionStream,Diligent::IMemoryAllocator>
           *this,HLSL2GLSLConverterImpl *CtorArgs,char **CtorArgs_1,
          IShaderSourceInputStreamFactory **CtorArgs_2,char **CtorArgs_3,unsigned_long *CtorArgs_4,
          bool *CtorArgs_5)

{
  undefined8 *puVar1;
  RefCountersImpl *pRefCounters;
  RefCountersImpl *this_00;
  ConversionStream *this_01;
  
  if (*(long **)(this + 8) == (long *)0x0) {
    this_00 = (RefCountersImpl *)::operator_new(0x30);
    (this_00->super_IReferenceCounters)._vptr_IReferenceCounters =
         (_func_int **)&PTR_AddStrongRef_00a4d978;
    (this_00->m_ObjectState)._M_i = NotInitialized;
    this_00->m_ObjectWrapperBuffer[0] = 0;
    this_00->m_ObjectWrapperBuffer[1] = 0;
    this_00->m_ObjectWrapperBuffer[2] = 0;
    this_00->m_NumStrongReferences = (__atomic_base<int>)0x0;
    this_00->m_NumWeakReferences = (__atomic_base<int>)0x0;
    (this_00->m_Lock).m_IsLocked._M_base._M_i = false;
    pRefCounters = this_00;
  }
  else {
    pRefCounters = (RefCountersImpl *)(**(code **)(**(long **)(this + 8) + 0x18))();
    this_00 = (RefCountersImpl *)0x0;
  }
  puVar1 = *(undefined8 **)this;
  if (puVar1 == (undefined8 *)0x0) {
    this_01 = (ConversionStream *)malloc(0xe0);
    HLSL2GLSLConverterImpl::ConversionStream::ConversionStream
              (this_01,&pRefCounters->super_IReferenceCounters,CtorArgs,*CtorArgs_1,*CtorArgs_2,
               *CtorArgs_3,*CtorArgs_4,*CtorArgs_5);
  }
  else {
    this_01 = (ConversionStream *)(**(code **)*puVar1)(puVar1,0xe0);
    HLSL2GLSLConverterImpl::ConversionStream::ConversionStream
              (this_01,&pRefCounters->super_IReferenceCounters,CtorArgs,*CtorArgs_1,*CtorArgs_2,
               *CtorArgs_3,*CtorArgs_4,*CtorArgs_5);
  }
  if (this_00 != (RefCountersImpl *)0x0) {
    RefCountersImpl::
    Attach<Diligent::HLSL2GLSLConverterImpl::ConversionStream,Diligent::IMemoryAllocator>
              (this_00,this_01,*(IMemoryAllocator **)this);
  }
  return this_01;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }